

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instantiation.cpp
# Opt level: O2

Clause * __thiscall
Inferences::Instantiation::ResultFn::operator()(ResultFn *this,Substitution *sub)

{
  Literal **ppLVar1;
  Self this_00;
  Literal *elem;
  Literal **ppLVar2;
  Clause *pCVar3;
  uint uVar4;
  uint uVar5;
  RStack<Literal_*> resLits;
  Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> local_88;
  ResultFn *local_78;
  GeneratingInference1 local_70;
  Inference local_60;
  
  Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  Recycled(&local_88);
  ppLVar1 = this->_cl->_literals;
  uVar5 = *(uint *)&this->_cl->field_0x38 & 0xfffff;
  uVar4 = (uint)(uVar5 != 0);
  ppLVar2 = (Literal **)0x0;
  local_78 = this;
  if (uVar5 != 0) {
    ppLVar2 = ppLVar1;
  }
  while (this_00._M_t.
         super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
         .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
              (__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
               )(__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
                 )local_88._self, ppLVar2 != (Literal **)0x0) {
    elem = Kernel::SubstHelper::apply<Kernel::Substitution>(*ppLVar2,sub);
    Lib::Stack<Kernel::Literal_*>::push
              ((Stack<Kernel::Literal_*> *)
               this_00._M_t.
               super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
               .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl,elem);
    ppLVar2 = ppLVar1 + (int)uVar4;
    if (uVar5 <= uVar4) {
      ppLVar2 = (Literal **)0x0;
    }
    uVar4 = uVar4 + (uVar4 < uVar5);
  }
  local_70.premise = local_78->_cl;
  local_70.rule = INSTANTIATION;
  Kernel::Inference::Inference(&local_60,&local_70);
  pCVar3 = Kernel::Clause::fromStack
                     ((Stack<Kernel::Literal_*> *)
                      local_88._self._M_t.
                      super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                      .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl,
                      &local_60);
  Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  ~Recycled(&local_88);
  return pCVar3;
}

Assistant:

Clause* operator()(Substitution sub)
  {
    RStack<Literal*> resLits;
    for(Literal* curr : _cl->iterLits()){
      resLits->push(SubstHelper::apply(curr,sub));
    }

    return Clause::fromStack(*resLits,GeneratingInference1(InferenceRule::INSTANTIATION,_cl));
  }